

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

int get_tok(char *c_orig,char **c,size_t *bsz,size_t *toksz,int *line)

{
  char cVar1;
  ulong __n;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  char *__s1;
  bool bVar7;
  
  uVar6 = *bsz;
  bVar7 = uVar6 == 0;
  if (bVar7) {
    return 0;
  }
  __s1 = *c;
  while( true ) {
    lVar5 = (long)*__s1;
    iVar2 = ws[lVar5];
    while (iVar2 != 0) {
      __s1 = __s1 + 1;
      uVar6 = uVar6 - 1;
      if ((char)lVar5 == '\n') {
        *line = *line + 1;
      }
      *bsz = uVar6;
      *c = __s1;
      bVar7 = uVar6 == 0;
      if (bVar7) {
        return 0;
      }
      lVar5 = (long)*__s1;
      iVar2 = ws[lVar5];
    }
    if (bVar7) {
      return 0;
    }
    cVar1 = *__s1;
    if (cVar1 != '#') break;
    do {
      __s1 = __s1 + 1;
      bVar7 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar7) {
        return 0;
      }
      *c = __s1;
      *bsz = uVar6;
    } while (*__s1 != '\n');
    bVar7 = uVar6 == 0;
    if (bVar7) {
      return 0;
    }
  }
  lVar5 = 0;
  do {
    __n = kw[lVar5].len;
    if ((__n <= uVar6) && (iVar2 = bcmp(__s1,kw[lVar5].str,__n), iVar2 == 0)) {
      uVar3 = kw[lVar5].id;
      pcVar4 = __s1;
      if ((0x18 < uVar3) || ((0x10000a4U >> (uVar3 & 0x1f) & 1) == 0)) {
        while ((pcVar4 = pcVar4 + -1, c_orig < pcVar4 && ((long)*pcVar4 != 10))) {
          if (ws[*pcVar4] == 0) goto LAB_00107a05;
        }
      }
      pcVar4 = __s1 + __n;
      if (uVar6 <= __n) {
        pcVar4 = " ";
      }
      if (ws[*pcVar4] != 0) {
        *toksz = __n;
        return uVar3;
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x19);
LAB_00107a05:
  if (cVar1 == '\"') {
    *toksz = 1;
    do {
      uVar6 = *toksz;
      if (*bsz <= uVar6) {
        return -1;
      }
      *toksz = uVar6 + 1;
      if (__s1[uVar6] == '\n') {
        return -1;
      }
    } while (__s1[uVar6] != '\"');
    uVar3 = 0x1b;
  }
  else {
    *toksz = 0;
    if (*bsz == 0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar6 = 0;
      do {
        if (ws[__s1[uVar6]] != 0) goto LAB_00107a6f;
        uVar6 = uVar6 + 1;
        *toksz = uVar6;
      } while (uVar6 < *bsz);
      uVar6 = 1;
LAB_00107a6f:
      uVar3 = -(uint)(uVar6 == 0) | 3;
    }
  }
  return uVar3;
}

Assistant:

int get_tok(char *c_orig, char **c, size_t *bsz, size_t *toksz, int *line) {
  char *e;
  int leading_nl=0;

 again:
  /* skip leading whitespace */
  while(*bsz && ws[(int)**c]) {
    if (**c=='\n') { 
      leading_nl=1;
      (*line)++;
    }
    (*bsz)--; (*c)++;
  }
  if (*bsz == 0) return 0; // end of input

  /* disregard comments til end of line */
  if (**c=='#') {
    while (*bsz) {
      (*c)++; (*bsz)--;
      if (**c == '\n') goto again;
    }
    return 0; /* eob while looking for trailing newline */
  }

  /* identify literal keywords */
  int i;
  for(i=0; i < sizeof(kw)/sizeof(*kw); i++) {
    if (*bsz < kw[i].len) continue;
    if (memcmp(*c,kw[i].str,kw[i].len) ) continue;
    /* keywords except "{ on to every" must be preceded by start-of-buf or newline */
    if (kw[i].id != TOK_LCURLY && 
        kw[i].id != TOK_ON     && 
        kw[i].id != TOK_TO     && 
        kw[i].id != TOK_EVERY) {
      for(e=(*c)-1; e > c_orig; e--) {
        if (*e == '\n') break;
        if (ws[(int)*e]) continue;
        /* has non-newline chars preceding, so do not consider as a keyword */
        else goto quoted; 
      }
    }
    /* require keywords to end with space or eob */
    e = (*bsz > kw[i].len) ? (*c + kw[i].len) : " ";
    if (!ws[(int)(*e)]) continue;
    *toksz = kw[i].len;
    return kw[i].id;
  }

 quoted:
  /* identify quoted string that ends with the closing quote on same line */
  if (**c=='"') {
    *toksz=1;
    while (*toksz < *bsz) {
      e = *c + *toksz;
      (*toksz)++;
      if (*e == '"') return TOK_QUOTEDSTR;
      if (*e == '\n') return -1;
    }
    return -1; /* eob without terminating quote */
  }

  /* otherwise its a string ending with end-of-buffer or whitespace */
  *toksz=0; 
  while ((*toksz < *bsz) && (!ws[(int)*(*c+*toksz)])) (*toksz)++;
  if (*toksz) return TOK_STR; 

  return -1;
}